

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::
num_writer::operator()(num_writer *this,char *it)

{
  undefined1 value [16];
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  int digit_index;
  const_iterator group;
  undefined1 in_stack_ffffffffffffffc0 [12];
  undefined8 local_8;
  
  local_8 = **(undefined8 **)(this + 0x18);
  value._8_8_ = this + 0x20;
  value._0_8_ = this;
  add_thousands_sep.s.data_ = (char *)&local_8;
  add_thousands_sep.this = (num_writer *)0x1;
  add_thousands_sep.s.size_ = (size_t)&stack0xffffffffffffffcc;
  add_thousands_sep._24_12_ = in_stack_ffffffffffffffc0;
  add_thousands_sep.digit_index._4_4_ = 0;
  pcVar1 = detail::operator()(it,(unsigned___int128)value,(int)*(undefined8 *)this,add_thousands_sep
                             );
  return pcVar1;
}

Assistant:

It operator()(It it) const {
      basic_string_view<Char> s(&sep, sep_size);
      // Index of a decimal digit with the least significant digit having
      // index 0.
      int digit_index = 0;
      std::string::const_iterator group = groups.cbegin();
      return format_decimal<Char>(
          it, abs_value, size, [this, s, &group, &digit_index](Char*& buffer) {
            if (*group <= 0 || ++digit_index % *group != 0 ||
                *group == max_value<char>())
              return;
            if (group + 1 != groups.cend()) {
              digit_index = 0;
              ++group;
            }
            buffer -= s.size();
            std::uninitialized_copy(s.data(), s.data() + s.size(),
                                    make_checked(buffer, s.size()));
          });
    }